

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_add_offset(roaring_bitmap_t *bm,int64_t offset)

{
  byte bVar1;
  container_t *c;
  uint uVar2;
  uint uVar3;
  roaring_array_t *prVar4;
  container_t *pcVar5;
  roaring_bitmap_t *prVar6;
  uint8_t typecode;
  uint16_t offset_00;
  ulong uVar7;
  container_t **hic;
  uint uVar8;
  container_t **loc;
  array_container_t *c_00;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint8_t new_t;
  container_t *hi;
  container_t *lo;
  uint8_t local_71;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  uint local_5c;
  roaring_bitmap_t *local_58;
  long local_50;
  container_t *local_48;
  container_t *local_40;
  container_t *local_38;
  
  if (offset == 0) {
    prVar6 = roaring_bitmap_copy(bm);
    return prVar6;
  }
  uVar3 = (bm->high_low_container).size;
  local_50 = offset >> 0x10;
  prVar4 = &roaring_bitmap_create()->high_low_container;
  bVar1 = (bm->high_low_container).flags;
  prVar4->flags = prVar4->flags & 0xfe | bVar1 & 1;
  if ((short)offset == 0) {
    uVar8 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    local_68 = (roaring_array_t *)(CONCAT44(local_68._4_4_,(uint)bVar1) & 0xffffffff00000001);
    iVar9 = 0;
    for (; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      uVar11 = (ulong)(bm->high_low_container).keys[uVar8 & 0xffff] + local_50;
      if (uVar11 < 0x10000) {
        ra_append_copy(prVar4,&bm->high_low_container,(uint16_t)uVar8,SUB81(local_68,0));
        lVar10 = (long)iVar9;
        iVar9 = iVar9 + 1;
        prVar4->keys[lVar10] = (uint16_t)uVar11;
      }
    }
  }
  else {
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    local_70 = (uint)offset & 0xffff;
    local_6c = uVar3;
    local_68 = prVar4;
    local_58 = bm;
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      local_48 = (container_t *)0x0;
      local_40 = (container_t *)0x0;
      uVar2 = uVar8 & 0xffff;
      uVar7 = (ulong)(bm->high_low_container).keys[uVar2];
      uVar11 = local_50 + uVar7;
      loc = &local_40;
      if (0xffff < uVar11) {
        loc = (container_t **)0x0;
      }
      hic = &local_48;
      if ((uVar7 + local_50) - 0xffff < 0xffffffffffff0000) {
        hic = (container_t **)0x0;
      }
      if (0xfffffffffffefffe < uVar11 - 0x10000) {
        typecode = (bm->high_low_container).typecodes[uVar2];
        c_00 = (array_container_t *)(bm->high_low_container).containers[uVar2];
        if (typecode == '\x04') {
          typecode = *(uint8_t *)&c_00->array;
          c_00 = *(array_container_t **)c_00;
        }
        offset_00 = (uint16_t)local_70;
        if (typecode == '\x03') {
          run_container_offset((run_container_t *)c_00,loc,hic,offset_00);
        }
        else if (typecode == '\x02') {
          array_container_offset(c_00,loc,hic,offset_00);
        }
        else {
          bitset_container_offset((bitset_container_t *)c_00,loc,hic,offset_00);
        }
        c = local_40;
        prVar4 = local_68;
        if (local_40 != (container_t *)0x0) {
          lVar10 = (long)local_68->size;
          if ((lVar10 == 0) ||
             (uVar3 = local_68->size - 1U & 0xffff, (uint)local_68->keys[uVar3] != (uint)uVar11)) {
            ra_append(local_68,(uint16_t)uVar11,local_40,typecode);
            bm = local_58;
            uVar3 = local_6c;
          }
          else {
            local_38 = local_68->containers[uVar3];
            local_5c = (uint)local_68->typecodes[uVar3];
            pcVar5 = container_ior(local_38,local_68->typecodes[uVar3],local_40,typecode,&local_71);
            prVar4->containers[lVar10 + -1] = pcVar5;
            prVar4->typecodes[lVar10 + -1] = local_71;
            if (local_38 != pcVar5) {
              container_free(local_38,(uint8_t)local_5c);
            }
            container_free(c,typecode);
            bm = local_58;
            uVar3 = local_6c;
          }
        }
        prVar4 = local_68;
        if (local_48 != (container_t *)0x0) {
          ra_append(local_68,(uint16_t)uVar11 + 1,local_48,typecode);
        }
      }
    }
    roaring_bitmap_repair_after_lazy((roaring_bitmap_t *)prVar4);
  }
  return (roaring_bitmap_t *)prVar4;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_add_offset(const roaring_bitmap_t *bm,
                                            int64_t offset) {
    roaring_bitmap_t *answer;
    roaring_array_t *ans_ra;
    int64_t container_offset;
    uint16_t in_offset;

    const roaring_array_t *bm_ra = &bm->high_low_container;
    int length = bm_ra->size;

    if (offset == 0) {
        return roaring_bitmap_copy(bm);
    }

    container_offset = offset >> 16;
    in_offset = (uint16_t)(offset - container_offset * (1 << 16));

    answer = roaring_bitmap_create();
    bool cow = is_cow(bm);
    roaring_bitmap_set_copy_on_write(answer, cow);

    ans_ra = &answer->high_low_container;

    if (in_offset == 0) {
        ans_ra = &answer->high_low_container;

        for (int i = 0, j = 0; i < length; ++i) {
            int64_t key = ra_get_key_at_index(bm_ra, (uint16_t)i);
            key += container_offset;

            if (key < 0 || key >= (1 << 16)) {
                continue;
            }
            ra_append_copy(ans_ra, bm_ra, (uint16_t)i, cow);
            ans_ra->keys[j++] = (uint16_t)key;
        }
        return answer;
    }

    uint8_t t;
    const container_t *c;
    container_t *lo, *hi, **lo_ptr, **hi_ptr;
    int64_t k;

    for (int i = 0; i < length; ++i) {
        lo = hi = NULL;
        lo_ptr = hi_ptr = NULL;

        k = ra_get_key_at_index(bm_ra, (uint16_t)i) + container_offset;
        if (k >= 0 && k < (1 << 16)) {
            lo_ptr = &lo;
        }
        if (k + 1 >= 0 && k + 1 < (1 << 16)) {
            hi_ptr = &hi;
        }
        if (lo_ptr == NULL && hi_ptr == NULL) {
            continue;
        }
        c = ra_get_container_at_index(bm_ra, (uint16_t)i, &t);
        c = container_unwrap_shared(c, &t);

        container_add_offset(c, t, lo_ptr, hi_ptr, in_offset);
        if (lo != NULL) {
            offset_append_with_merge(ans_ra, (int)k, lo, t);
        }
        if (hi != NULL) {
            ra_append(ans_ra, (uint16_t)(k + 1), hi, t);
        }
        // the `lo` and `hi` container type always keep same as container `c`.
        // in the case of `container_add_offset` on bitset container, `lo` and
        // `hi` may has small cardinality, they must be repaired to array
        // container.
    }

    roaring_bitmap_repair_after_lazy(answer);  // do required type conversions.
    return answer;
}